

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

Matrix_t SE3_Ry(float degree)

{
  float fVar1;
  Matrix_t MVar2;
  float *pfVar3;
  double dVar4;
  float *se_y;
  int j;
  int i;
  float rad;
  float degree_local;
  Matrix_t temp;
  
  fVar1 = (degree / 180.0) * 3.1415927;
  pfVar3 = (float *)malloc(0x40);
  if (pfVar3 == (float *)0x0) {
    printf("ERROR: Malloc failed!-08");
  }
  for (se_y._4_4_ = 0; se_y._4_4_ < 4; se_y._4_4_ = se_y._4_4_ + 1) {
    for (se_y._0_4_ = 0; (int)se_y < 4; se_y._0_4_ = (int)se_y + 1) {
      pfVar3[(long)(se_y._4_4_ << 2) + (long)(int)se_y] = 0.0;
    }
  }
  dVar4 = cos((double)fVar1);
  *pfVar3 = (float)dVar4;
  dVar4 = sin((double)fVar1);
  pfVar3[2] = (float)dVar4;
  pfVar3[5] = 1.0;
  dVar4 = sin((double)fVar1);
  pfVar3[8] = -(float)dVar4;
  dVar4 = cos((double)fVar1);
  pfVar3[10] = (float)dVar4;
  pfVar3[0xf] = 1.0;
  MVar2.row = 4;
  MVar2.pMatrix = pfVar3;
  MVar2.column = 4;
  MVar2._10_6_ = temp.pMatrix._2_6_;
  return MVar2;
}

Assistant:

Matrix_t SE3_Ry(float degree)
{
	float rad = (float)(degree / 180.0 * PI);
	int i, j;
	Matrix_t temp;
	float *se_y = (float *)malloc(sizeof(float) * 4 * 4);
	if (se_y == NULL)
		printf("ERROR: Malloc failed!-08");
	for (i = 0; i < 4; i++)
		for (j = 0; j < 4; j++)
			*(se_y + i * 4 + j) = 0;
	*(se_y + 0 * 4 + 0) = (float)cos(rad);
	*(se_y + 0 * 4 + 2) = (float)sin(rad);
	*(se_y + 1 * 4 + 1) = 1;
	*(se_y + 2 * 4 + 0) = -(float)sin(rad);
	*(se_y + 2 * 4 + 2) = (float)cos(rad);
	*(se_y + 3 * 4 + 3) = 1;

	temp.pMatrix = se_y;
	temp.row = 4;
	temp.column = 4;

	return temp;
}